

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> __thiscall
spvtools::MakeUnique<spvtools::opt::Loop,spvtools::opt::Loop&>(spvtools *this,Loop *args)

{
  Loop *this_00;
  Loop *args_local;
  
  this_00 = (Loop *)::operator_new(0x90);
  opt::Loop::Loop(this_00,args);
  std::unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>>::
  unique_ptr<std::default_delete<spvtools::opt::Loop>,void>
            ((unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>> *)this,
             this_00);
  return (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>
         )(__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}